

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

FILE * print_prep(int table,int update)

{
  int iVar1;
  char *pcVar2;
  uint in_ESI;
  int in_EDI;
  int this_segment;
  FILE *res;
  char upath [128];
  int in_stack_000000d4;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int local_a4;
  char local_98 [136];
  uint local_10;
  int local_c;
  FILE *local_8;
  
  local_c = in_EDI;
  if (updates == 0) {
    local_8 = (FILE *)tbl_open(in_stack_000000d4,(char *)upath._120_8_);
    if (local_8 == (FILE *)0x0) {
      fprintf(_stderr,"Open failed for %s at %s:%d\n",tdefs[local_c].name,
              "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/print.c",
              0x3c);
      exit(1);
    }
  }
  else {
    local_10 = in_ESI;
    if ((int)in_ESI < 1) {
      if (delete_segments == 0) {
        pcVar2 = env_config((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)0x1074a0);
        sprintf(local_98,"%s%cdelete.%d",pcVar2,0x2f,(ulong)-local_10);
      }
      else {
        delete_segment = delete_segment + 1;
        pcVar2 = env_config((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            (char *)0x107441);
        sprintf(local_98,"%s%cdelete.u%d.%d",pcVar2,0x2f,(long)(int)-local_10 % 10000 & 0xffffffff,
                (ulong)(uint)delete_segment);
      }
    }
    else if (insert_segments == 0) {
      pcVar2 = env_config((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)0x1073c2);
      sprintf(local_98,"%s%c%s.u%d",pcVar2,0x2f,tdefs[local_c].name,(ulong)local_10);
    }
    else {
      iVar1 = strcmp(tdefs[in_EDI].name,"orders.tbl");
      if (iVar1 == 0) {
        insert_lineitem_segment = insert_lineitem_segment + 1;
        local_a4 = insert_lineitem_segment;
      }
      else {
        insert_orders_segment = insert_orders_segment + 1;
        local_a4 = insert_orders_segment;
      }
      pcVar2 = env_config((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (char *)0x10734f);
      sprintf(local_98,"%s%c%s.u%d.%d",pcVar2,0x2f,tdefs[local_c].name,
              (long)(int)local_10 % 10000 & 0xffffffff,local_a4);
    }
    local_8 = fopen64(local_98,"w");
  }
  return (FILE *)local_8;
}

Assistant:

FILE *
print_prep(int table, int update)
{
	char upath[128];
	FILE *res;

	if (updates)
		{
		if (update > 0) /* updates */
			if ( insert_segments )
				{
				int this_segment;
				if(strcmp(tdefs[table].name,"orders.tbl"))
					this_segment=++insert_orders_segment;
				else 
					this_segment=++insert_lineitem_segment;
				sprintf(upath, "%s%c%s.u%d.%d", 
					env_config(PATH_TAG, PATH_DFLT),
					PATH_SEP, tdefs[table].name, update%10000,this_segment);
				}
			else
				{
				sprintf(upath, "%s%c%s.u%d",
				env_config(PATH_TAG, PATH_DFLT),
				PATH_SEP, tdefs[table].name, update);
				}
		else /* deletes */
			if ( delete_segments )
				{
				++delete_segment;
				sprintf(upath, "%s%cdelete.u%d.%d",
					env_config(PATH_TAG, PATH_DFLT), PATH_SEP, -update%10000,
					delete_segment);
				}
			else
				{
				sprintf(upath, "%s%cdelete.%d",
				env_config(PATH_TAG, PATH_DFLT), PATH_SEP, -update);
				}
		return(fopen(upath, "w"));
        }
    res = tbl_open(table, "w");
    OPEN_CHECK(res, tdefs[table].name);
    return(res);
}